

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::CopyFrom
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZMatrix<double> *mat)

{
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this_00;
  long in_RSI;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>
  *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)0x0;
  }
  else {
    this_00 = (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
              __dynamic_cast(in_RSI,&TPZMatrix<double>::typeinfo,
                             &TPZFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontNonSym<double>>
                              ::typeinfo,0);
  }
  if (this_00 == (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)0x0)
  {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZFrontMatrix<double, TPZStackEqnStorage<double>, TPZFrontNonSym<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double, store = TPZStackEqnStorage<double>, front = TPZFrontNonSym<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }